

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int __thiscall
chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>::clone
          (Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<Unique_Ptr_Test_Base_Class> local_20;
  Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_> *this_local;
  
  local_20.super___shared_ptr<Unique_Ptr_Test_Base_Class,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>>,std::shared_ptr<Unique_Ptr_Test_Base_Class>const&>
            (&local_20);
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>>,std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>>>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
              *)this,(unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>_>_>
                      *)&local_20);
  Catch::clara::std::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<Unique_Ptr_Test_Base_Class>_>_>_>
                 *)&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }